

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestBranchNoName::Run(TestBranchNoName *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  pointer outputter;
  reference pvVar4;
  long lVar5;
  bool local_2a1;
  string local_270 [39];
  allocator local_249;
  RunParams local_248;
  undefined1 local_230 [8];
  Results rs;
  string local_210 [32];
  undefined1 local_1f0 [8];
  TestBranchInternal2 myTestA;
  unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
  local_1a0;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> local_198;
  unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_> op;
  ostringstream oss;
  TestBranchNoName *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&op);
  std::make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0)
  ;
  std::unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>>::
  unique_ptr<testinator::DefaultOutputter,std::default_delete<testinator::DefaultOutputter>,void>
            ((unique_ptr<testinator::Outputter,std::default_delete<testinator::Outputter>> *)
             &local_198,&local_1a0);
  std::unique_ptr<testinator::DefaultOutputter,_std::default_delete<testinator::DefaultOutputter>_>
  ::~unique_ptr(&local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_210,"A",
             (allocator *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  TestBranchInternal2::TestBranchInternal2((TestBranchInternal2 *)local_1f0,(string *)local_210);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_248.m_flags = 0;
  local_248._4_4_ = 0;
  local_248.m_numPropertyChecks = 0;
  local_248.m_randomSeed = 0;
  testinator::RunParams::RunParams(&local_248);
  outputter = std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::
              get(&local_198);
  testinator::RunAllTests((Results *)local_230,&local_248,outputter);
  if ((Run()::expected_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Run()::expected_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)Run()::expected_abi_cxx11_,"main.cpp:448",&local_249);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    __cxa_atexit(std::__cxx11::string::~string,Run()::expected_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&Run()::expected_abi_cxx11_);
  }
  bVar2 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::empty
                    ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_230);
  bVar1 = false;
  local_2a1 = false;
  if (!bVar2) {
    pvVar4 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::front
                       ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_230
                       );
    local_2a1 = false;
    if ((pvVar4->m_success & 1U) != 0) {
      std::__cxx11::ostringstream::str();
      bVar1 = true;
      lVar5 = std::__cxx11::string::find(local_270,0x2c6b20);
      local_2a1 = lVar5 != -1;
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string(local_270);
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_230);
  TestBranchInternal2::~TestBranchInternal2((TestBranchInternal2 *)local_1f0);
  std::unique_ptr<testinator::Outputter,_std::default_delete<testinator::Outputter>_>::~unique_ptr
            (&local_198);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&op);
  return local_2a1;
}

Assistant:

virtual bool Run()
  {
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss);
    TestBranchInternal2 myTestA("A");
    testinator::Results rs = testinator::RunAllTests(testinator::RunParams(), op.get());

    static string expected = "main.cpp:448";
    return !rs.empty() && rs.front().m_success
      && oss.str().find(expected) != string::npos;
  }